

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

Error uv11::timer_start(Timer *timer,Callback *callback,uint64_t timeout,uint64_t repeat)

{
  int s;
  Error EVar2;
  error_category *peVar3;
  error_code eVar1;
  
  std::function<void_(uv11::Timer_&)>::operator=(&timer->callback,callback);
  s = uv_timer_start(&(timer->super_HandleBase<uv_timer_s>).super_WrappedObject<uv_timer_s>,
                     timer_start::anon_class_1_0_00000001::__invoke,timeout,repeat);
  eVar1 = make_error(s);
  EVar2._M_value = eVar1._M_value;
  EVar2._4_4_ = eVar1._4_4_;
  register0x00000010 = eVar1._M_cat;
  return EVar2;
}

Assistant:

Error uv11::timer_start(Timer& timer, Timer::Callback const& callback, uint64_t timeout, uint64_t repeat) {
    timer.callback = callback;

    int s = ::uv_timer_start(
        &timer.Get(),
        [] (uv_timer_t* t) {
            Timer* ptr = reinterpret_cast<Timer*>(t->data);
            auto c = ptr->callback;
            c(*ptr);
        },
        timeout, repeat
    );

    return make_error(s);
}